

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.h
# Opt level: O0

void __thiscall Sequence<DNA>::Sequence(Sequence<DNA> *this,Sequence<DNA> *sequence)

{
  Sequence<DNA> *sequence_local;
  Sequence<DNA> *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)sequence);
  std::__cxx11::string::string((string *)&this->quality,(string *)&sequence->quality);
  std::__cxx11::string::string((string *)&this->sequence,(string *)&sequence->sequence);
  return;
}

Assistant:

Sequence< A >::Sequence( Sequence< A >&& sequence )
    : sequence( std::move( sequence.sequence ) ),
      identifier( std::move( sequence.identifier ) ),
      quality( std::move( sequence.quality ) ) {}